

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O0

void __thiscall GrcManager::AddToFsmClasses(GrcManager *this,GdlGlyphClassDefn *pglfc,int nPassID)

{
  bool bVar1;
  vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *this_00;
  int in_EDX;
  GdlGlyphClassDefn *in_RSI;
  long in_RDI;
  vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *pvpglfcThisPass;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe8;
  int nPassID_00;
  
  this_00 = (vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)
            (*(long *)(in_RDI + 0x268) + (long)in_EDX * 0x18);
  bVar1 = GdlGlyphClassDefn::IsFsmClass
                    ((GdlGlyphClassDefn *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                     (int)((ulong)this_00 >> 0x20));
  if (!bVar1) {
    nPassID_00 = in_EDX;
    std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::size(this_00);
    GdlGlyphClassDefn::MarkFsmClass(in_RSI,nPassID_00,in_stack_ffffffffffffffe8);
    std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::push_back
              (this_00,(value_type *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8));
  }
  return;
}

Assistant:

void GrcManager::AddToFsmClasses(GdlGlyphClassDefn * pglfc, int nPassID)
{
	std::vector<GdlGlyphClassDefn *> * pvpglfcThisPass = m_prgvpglfcFsmClasses + nPassID;
	if (pglfc->IsFsmClass(nPassID))
	{
		//	Already assigned an ID for this pass.
		Assert((*pvpglfcThisPass)[pglfc->FsmID(nPassID)] == pglfc);
		return;
	}
	pglfc->MarkFsmClass(nPassID, int(pvpglfcThisPass->size()));
	pvpglfcThisPass->push_back(pglfc);
}